

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O1

QVariant * __thiscall
QtPrivate::QCalendarModel::data
          (QVariant *__return_storage_ptr__,QCalendarModel *this,QModelIndex *index,int role)

{
  DayOfWeek DVar1;
  int column;
  int iVar2;
  int col;
  int iVar3;
  uint uVar4;
  int iVar5;
  DayOfWeek day;
  long in_FS_OFFSET;
  QDate date;
  QDate date_1;
  undefined1 local_58 [16];
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (role == 7) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      ::QVariant::QVariant(__return_storage_ptr__,0x84);
      return __return_storage_ptr__;
    }
    goto LAB_003cf6c0;
  }
  iVar3 = index->r;
  column = index->c;
  if (role == 0) {
    if (((column == 0) && (this->m_weekNumbersShown != false)) &&
       (iVar3 < this->m_firstRow + 6 && this->m_firstRow <= iVar3)) {
      local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      iVar5 = this->m_firstColumn - this->m_firstDay;
      iVar2 = iVar5 + 8;
      if ((int)this->m_firstDay < 2) {
        iVar2 = iVar5 + 1;
      }
      local_48.d.d = (Data *)dateForCell(this,iVar3,iVar2);
      if (0x16d3e147973 < (long)local_48.d.d + 0xb69eeff91fU) goto LAB_003cf51d;
      iVar3 = QDate::weekNumber((int *)&local_48);
LAB_003cf5cc:
      ::QVariant::QVariant(__return_storage_ptr__,iVar3);
    }
    else {
LAB_003cf51d:
      if ((iVar3 == 0) && (this->m_horizontalHeaderFormat != NoHorizontalHeader)) {
        iVar2 = this->m_firstColumn;
        uVar4 = column - iVar2;
        if (iVar2 + 7 <= column || column < iVar2) goto LAB_003cf581;
        day = Sunday;
        if (uVar4 < 7) {
          DVar1 = this->m_firstDay + uVar4;
          day = (this->m_firstDay - Sunday) + uVar4;
          if ((int)DVar1 < 8) {
            day = DVar1;
          }
        }
        dayName(&local_48,this,day);
        ::QVariant::QVariant(__return_storage_ptr__,(QString *)&local_48);
      }
      else {
LAB_003cf581:
        local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58._0_8_ = dateForCell(this,iVar3,column);
        if (local_58._0_8_ + 0xb69eeff91f < 0x16d3e147974) {
          iVar3 = QDate::day(local_58,*(undefined8 *)&this->m_calendar);
          goto LAB_003cf5cc;
        }
        local_48.d.d = (Data *)0x0;
        local_48.d.ptr = (char16_t *)0x0;
        local_48.d.size = 0;
        ::QVariant::QVariant(__return_storage_ptr__,(QString *)&local_48);
      }
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    goto LAB_003cf65e;
  }
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  formatForCell((QTextCharFormat *)local_58,this,iVar3,column);
  switch(role) {
  case 3:
    QTextFormat::stringProperty((int)&local_48);
    ::QVariant::QVariant(__return_storage_ptr__,(QString *)&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    break;
  default:
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
    break;
  case 6:
    QTextCharFormat::font();
    QFont::operator_cast_to_QVariant(__return_storage_ptr__,(QFont *)&local_48);
    QFont::~QFont((QFont *)&local_48);
    break;
  case 8:
    iVar3 = (int)&local_48;
    goto LAB_003cf622;
  case 9:
    iVar3 = (int)&local_48;
LAB_003cf622:
    QTextFormat::brushProperty(iVar3);
    QColor::operator_cast_to_QVariant(__return_storage_ptr__,(QColor *)((long)local_48.d.d + 8));
    QBrush::~QBrush((QBrush *)&local_48);
  }
  QTextFormat::~QTextFormat((QTextFormat *)local_58);
LAB_003cf65e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
LAB_003cf6c0:
  __stack_chk_fail();
}

Assistant:

QVariant QCalendarModel::data(const QModelIndex &index, int role) const
{
    if (role == Qt::TextAlignmentRole)
        return (int) Qt::AlignCenter;

    int row = index.row();
    int column = index.column();

    if (role == Qt::DisplayRole) {
        if (m_weekNumbersShown && column == HeaderColumn
            && row >= m_firstRow && row < m_firstRow + RowCount) {
            QDate date = dateForCell(row, columnForDayOfWeek(Qt::Monday));
            if (date.isValid())
                return date.weekNumber();
        }
        if (m_horizontalHeaderFormat != QCalendarWidget::NoHorizontalHeader && row == HeaderRow
            && column >= m_firstColumn && column < m_firstColumn + ColumnCount)
            return dayName(dayOfWeekForColumn(column));
        QDate date = dateForCell(row, column);
        if (date.isValid())
            return date.day(m_calendar);
        return QString();
    }

    QTextCharFormat fmt = formatForCell(row, column);
    if (role == Qt::BackgroundRole)
        return fmt.background().color();
    if (role == Qt::ForegroundRole)
        return fmt.foreground().color();
    if (role == Qt::FontRole)
        return fmt.font();
    if (role == Qt::ToolTipRole)
        return fmt.toolTip();
    return QVariant();
}